

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SingleFileStorageCommitState::RevertCommit(SingleFileStorageCommitState *this)

{
  idx_t iVar1;
  
  if (this->state != IN_PROGRESS) {
    return;
  }
  iVar1 = WriteAheadLog::GetTotalWritten(this->wal);
  if (this->initial_written < iVar1) {
    WriteAheadLog::Truncate(this->wal,this->initial_wal_size);
  }
  this->state = TRUNCATED;
  return;
}

Assistant:

void SingleFileStorageCommitState::RevertCommit() {
	if (state != WALCommitState::IN_PROGRESS) {
		return;
	}
	if (wal.GetTotalWritten() > initial_written) {
		// remove any entries written into the WAL by truncating it
		wal.Truncate(initial_wal_size);
	}
	state = WALCommitState::TRUNCATED;
}